

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::sse42::
BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMIntersector1Moeller<4,_true>_>_>
::intersect(BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMIntersector1Moeller<4,_true>_>_>
            *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  Collider CVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte *pbVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  RayQueryContext *pRVar10;
  byte bVar11;
  int iVar12;
  undefined1 *puVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  byte *pbVar17;
  byte *pbVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  RayQueryContext *pRVar26;
  ulong uVar27;
  Scene *pSVar28;
  ulong uVar29;
  float fVar30;
  uint uVar31;
  float fVar42;
  float fVar44;
  vint4 bi;
  undefined1 auVar32 [16];
  uint uVar43;
  uint uVar45;
  float fVar46;
  uint uVar47;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 bi_1;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  uint uVar53;
  float fVar54;
  float fVar55;
  uint uVar56;
  float fVar57;
  float fVar58;
  uint uVar59;
  vint4 ai;
  float fVar60;
  uint uVar61;
  float fVar62;
  float fVar66;
  float fVar67;
  vint4 ai_1;
  undefined1 auVar63 [16];
  float fVar68;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar73;
  float fVar77;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined4 uVar89;
  float fVar90;
  float fVar91;
  undefined4 uVar92;
  float fVar93;
  undefined4 uVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  uint local_11b8;
  int local_119c;
  undefined8 local_1198;
  float fStack_1190;
  float fStack_118c;
  undefined1 local_1188 [16];
  long local_1170;
  long local_1168;
  ulong local_1160;
  ulong local_1158;
  byte *local_1150;
  RayHit *local_1148;
  long local_1140;
  int *local_1138;
  byte *local_1130;
  uint *local_1128;
  Intersectors *local_1120;
  undefined4 *local_1118;
  undefined4 local_1110;
  undefined4 local_1108;
  undefined4 local_1104;
  float local_1100;
  float local_10fc;
  float local_10f8;
  undefined4 local_10f4;
  uint local_10f0;
  uint local_10ec;
  uint local_10e8;
  float local_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8 [4];
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined1 local_1068 [16];
  float local_1058 [4];
  float local_1048 [4];
  float local_1038 [4];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008 [4];
  uint local_ff8;
  uint uStack_ff4;
  uint uStack_ff0;
  uint uStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [3912];
  ulong uVar16;
  
  if (*(Scene **)(*(long *)this + 0x70) != (Scene *)0x8) {
    local_1148 = ray;
    pRVar26 = (RayQueryContext *)(local_f78 + 0x10);
    local_f78._0_8_ = *(Scene **)(*(long *)this + 0x70);
    local_f78._8_4_ = 0;
    fVar104 = *(float *)&This->ptr;
    fVar86 = *(float *)((long)&This->ptr + 4);
    fVar105 = *(float *)&This->leafIntersector;
    fVar62 = *(float *)((long)&This->leafIntersector + 4);
    CVar3 = This->collider;
    fVar73 = *(float *)&(This->intersector1).intersect;
    fVar77 = 0.0;
    if (0.0 <= fVar73) {
      fVar77 = fVar73;
    }
    auVar32._4_4_ = -(uint)(ABS(CVar3.collide._4_4_) < DAT_01f4bd50._4_4_);
    auVar32._0_4_ = -(uint)(ABS(CVar3.collide._0_4_) < (float)DAT_01f4bd50);
    auVar32._8_4_ = -(uint)(ABS(CVar3.name._0_4_) < DAT_01f4bd50._8_4_);
    auVar32._12_4_ = -(uint)(ABS(CVar3.name._4_4_) < DAT_01f4bd50._12_4_);
    auVar63 = blendvps((undefined1  [16])CVar3,_DAT_01f4bd50,auVar32);
    fVar73 = 0.0;
    if (0.0 <= fVar62) {
      fVar73 = fVar62;
    }
    auVar32 = rcpps(auVar32,auVar63);
    fVar85 = auVar32._0_4_;
    fVar87 = auVar32._4_4_;
    fVar90 = auVar32._8_4_;
    fVar85 = (1.0 - auVar63._0_4_ * fVar85) * fVar85 + fVar85;
    fVar87 = (1.0 - auVar63._4_4_ * fVar87) * fVar87 + fVar87;
    fVar90 = (1.0 - auVar63._8_4_ * fVar90) * fVar90 + fVar90;
    uVar25 = (ulong)(fVar85 < 0.0) << 4;
    uVar23 = (ulong)(fVar87 < 0.0) << 4 | 0x20;
    uVar19 = (ulong)(fVar90 < 0.0) << 4 | 0x40;
    uVar27 = uVar25 ^ 0x10;
    uVar20 = uVar23 ^ 0x10;
    puVar13 = mm_lookupmask_ps;
    _local_ff8 = mm_lookupmask_ps._240_8_;
    _uStack_ff0 = mm_lookupmask_ps._248_8_;
    local_f88 = fVar105;
    fStack_f84 = fVar105;
    fStack_f80 = fVar105;
    fStack_f7c = fVar105;
    local_f98 = fVar73;
    fStack_f94 = fVar73;
    fStack_f90 = fVar73;
    fStack_f8c = fVar73;
    local_fa8 = fVar90;
    fStack_fa4 = fVar90;
    fStack_fa0 = fVar90;
    fStack_f9c = fVar90;
    local_fb8 = fVar104;
    fStack_fb4 = fVar104;
    fStack_fb0 = fVar104;
    fStack_fac = fVar104;
    local_fc8 = fVar86;
    fStack_fc4 = fVar86;
    fStack_fc0 = fVar86;
    fStack_fbc = fVar86;
    local_fd8 = fVar85;
    fStack_fd4 = fVar85;
    fStack_fd0 = fVar85;
    fStack_fcc = fVar85;
    local_fe8 = fVar87;
    fStack_fe4 = fVar87;
    fStack_fe0 = fVar87;
    fStack_fdc = fVar87;
    fVar62 = fVar105;
    fVar66 = fVar105;
    fVar67 = fVar105;
    fVar68 = fVar73;
    fVar83 = fVar73;
    fVar84 = fVar73;
    fVar88 = fVar90;
    fVar91 = fVar90;
    fVar93 = fVar90;
    fVar96 = fVar104;
    fVar98 = fVar104;
    fVar100 = fVar104;
    fVar102 = fVar86;
    fVar103 = fVar86;
    fVar72 = fVar86;
    fVar82 = fVar85;
    fVar108 = fVar85;
    fVar110 = fVar85;
    fVar112 = fVar87;
    fVar114 = fVar87;
    fVar116 = fVar87;
    fVar54 = fVar77;
    fVar57 = fVar77;
    fVar69 = fVar77;
LAB_0067e8bd:
    if (pRVar26 != (RayQueryContext *)local_f78) {
      pRVar10 = pRVar26 + -1;
      pRVar26 = (RayQueryContext *)&pRVar26[-1].user;
      if (*(float *)&pRVar10->args < *(float *)&(This->intersector1).intersect ||
          *(float *)&pRVar10->args == *(float *)&(This->intersector1).intersect) {
        pSVar28 = *(Scene **)pRVar26;
        while (((ulong)pSVar28 & 8) == 0) {
          pfVar2 = (float *)((long)&(pSVar28->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper.field_0 + uVar25);
          fVar30 = (*pfVar2 - fVar104) * fVar85;
          fVar42 = (pfVar2[1] - fVar96) * fVar82;
          fVar44 = (pfVar2[2] - fVar98) * fVar108;
          fVar46 = (pfVar2[3] - fVar100) * fVar110;
          pfVar2 = (float *)((long)&(pSVar28->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper.field_0 + uVar23);
          fVar52 = (*pfVar2 - fVar86) * fVar87;
          fVar55 = (pfVar2[1] - fVar102) * fVar112;
          fVar58 = (pfVar2[2] - fVar103) * fVar114;
          fVar60 = (pfVar2[3] - fVar72) * fVar116;
          uVar53 = (uint)((int)fVar52 < (int)fVar30) * (int)fVar30 |
                   (uint)((int)fVar52 >= (int)fVar30) * (int)fVar52;
          uVar56 = (uint)((int)fVar55 < (int)fVar42) * (int)fVar42 |
                   (uint)((int)fVar55 >= (int)fVar42) * (int)fVar55;
          uVar59 = (uint)((int)fVar58 < (int)fVar44) * (int)fVar44 |
                   (uint)((int)fVar58 >= (int)fVar44) * (int)fVar58;
          uVar61 = (uint)((int)fVar60 < (int)fVar46) * (int)fVar46 |
                   (uint)((int)fVar60 >= (int)fVar46) * (int)fVar60;
          pfVar2 = (float *)((long)&(pSVar28->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper.field_0 + uVar19);
          fVar30 = (*pfVar2 - fVar105) * fVar90;
          fVar42 = (pfVar2[1] - fVar62) * fVar88;
          fVar44 = (pfVar2[2] - fVar66) * fVar91;
          fVar46 = (pfVar2[3] - fVar67) * fVar93;
          uVar31 = (uint)((int)fVar30 < (int)fVar73) * (int)fVar73 |
                   (uint)((int)fVar30 >= (int)fVar73) * (int)fVar30;
          uVar43 = (uint)((int)fVar42 < (int)fVar68) * (int)fVar68 |
                   (uint)((int)fVar42 >= (int)fVar68) * (int)fVar42;
          uVar45 = (uint)((int)fVar44 < (int)fVar83) * (int)fVar83 |
                   (uint)((int)fVar44 >= (int)fVar83) * (int)fVar44;
          uVar47 = (uint)((int)fVar46 < (int)fVar84) * (int)fVar84 |
                   (uint)((int)fVar46 >= (int)fVar84) * (int)fVar46;
          local_10b8[0] =
               (float)(((int)uVar31 < (int)uVar53) * uVar53 | ((int)uVar31 >= (int)uVar53) * uVar31)
          ;
          local_10b8[1] =
               (float)(((int)uVar43 < (int)uVar56) * uVar56 | ((int)uVar43 >= (int)uVar56) * uVar43)
          ;
          local_10b8[2] =
               (float)(((int)uVar45 < (int)uVar59) * uVar59 | ((int)uVar45 >= (int)uVar59) * uVar45)
          ;
          local_10b8[3] =
               (float)(((int)uVar47 < (int)uVar61) * uVar61 | ((int)uVar47 >= (int)uVar61) * uVar47)
          ;
          pfVar2 = (float *)((long)&(pSVar28->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper.field_0 + uVar27);
          fVar30 = (*pfVar2 - fVar104) * fVar85;
          fVar42 = (pfVar2[1] - fVar96) * fVar82;
          fVar44 = (pfVar2[2] - fVar98) * fVar108;
          fVar46 = (pfVar2[3] - fVar100) * fVar110;
          pfVar2 = (float *)((long)&(pSVar28->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper.field_0 + uVar20);
          fVar52 = (*pfVar2 - fVar86) * fVar87;
          fVar55 = (pfVar2[1] - fVar102) * fVar112;
          fVar58 = (pfVar2[2] - fVar103) * fVar114;
          fVar60 = (pfVar2[3] - fVar72) * fVar116;
          uVar53 = (uint)((int)fVar30 < (int)fVar52) * (int)fVar30 |
                   (uint)((int)fVar30 >= (int)fVar52) * (int)fVar52;
          uVar56 = (uint)((int)fVar42 < (int)fVar55) * (int)fVar42 |
                   (uint)((int)fVar42 >= (int)fVar55) * (int)fVar55;
          uVar59 = (uint)((int)fVar44 < (int)fVar58) * (int)fVar44 |
                   (uint)((int)fVar44 >= (int)fVar58) * (int)fVar58;
          uVar61 = (uint)((int)fVar46 < (int)fVar60) * (int)fVar46 |
                   (uint)((int)fVar46 >= (int)fVar60) * (int)fVar60;
          pfVar2 = (float *)((long)&(pSVar28->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper.field_0 + (uVar19 ^ 0x10));
          fVar30 = (*pfVar2 - fVar105) * fVar90;
          fVar42 = (pfVar2[1] - fVar62) * fVar88;
          fVar44 = (pfVar2[2] - fVar66) * fVar91;
          fVar46 = (pfVar2[3] - fVar67) * fVar93;
          uVar31 = (uint)((int)fVar77 < (int)fVar30) * (int)fVar77 |
                   (uint)((int)fVar77 >= (int)fVar30) * (int)fVar30;
          uVar43 = (uint)((int)fVar54 < (int)fVar42) * (int)fVar54 |
                   (uint)((int)fVar54 >= (int)fVar42) * (int)fVar42;
          uVar45 = (uint)((int)fVar57 < (int)fVar44) * (int)fVar57 |
                   (uint)((int)fVar57 >= (int)fVar44) * (int)fVar44;
          uVar47 = (uint)((int)fVar69 < (int)fVar46) * (int)fVar69 |
                   (uint)((int)fVar69 >= (int)fVar46) * (int)fVar46;
          auVar63._0_4_ =
               -(uint)((int)(((int)uVar53 < (int)uVar31) * uVar53 |
                            ((int)uVar53 >= (int)uVar31) * uVar31) < (int)local_10b8[0]);
          auVar63._4_4_ =
               -(uint)((int)(((int)uVar56 < (int)uVar43) * uVar56 |
                            ((int)uVar56 >= (int)uVar43) * uVar43) < (int)local_10b8[1]);
          auVar63._8_4_ =
               -(uint)((int)(((int)uVar59 < (int)uVar45) * uVar59 |
                            ((int)uVar59 >= (int)uVar45) * uVar45) < (int)local_10b8[2]);
          auVar63._12_4_ =
               -(uint)((int)(((int)uVar61 < (int)uVar47) * uVar61 |
                            ((int)uVar61 >= (int)uVar47) * uVar47) < (int)local_10b8[3]);
          uVar31 = movmskps((int)puVar13,auVar63);
          puVar13 = (undefined1 *)(ulong)uVar31;
          if (uVar31 == 0xf) goto LAB_0067e8bd;
          bVar11 = (byte)uVar31 ^ 0xf;
          uVar29 = (ulong)pSVar28 & 0xfffffffffffffff0;
          lVar22 = 0;
          if (bVar11 != 0) {
            for (; (bVar11 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
            }
          }
          puVar13 = *(undefined1 **)(uVar29 + lVar22 * 8);
          uVar31 = bVar11 - 1 & (uint)bVar11;
          context = pRVar26;
          pSVar28 = (Scene *)puVar13;
          if (uVar31 != 0) {
            fVar30 = local_10b8[lVar22];
            lVar22 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
              }
            }
            pSVar28 = *(Scene **)(uVar29 + lVar22 * 8);
            fVar42 = local_10b8[lVar22];
            uVar31 = uVar31 - 1 & uVar31;
            if (uVar31 == 0) {
              context = (RayQueryContext *)&pRVar26->args;
              if ((uint)fVar30 < (uint)fVar42) {
                pRVar26->scene = pSVar28;
                *(float *)&pRVar26->user = fVar42;
                pRVar26 = context;
                pSVar28 = (Scene *)puVar13;
              }
              else {
                pRVar26->scene = (Scene *)puVar13;
                *(float *)&pRVar26->user = fVar30;
                puVar13 = (undefined1 *)pSVar28;
                pRVar26 = context;
              }
            }
            else {
              auVar71._8_4_ = fVar30;
              auVar71._0_8_ = puVar13;
              auVar71._12_4_ = 0;
              auVar75._8_4_ = fVar42;
              auVar75._0_8_ = pSVar28;
              auVar75._12_4_ = 0;
              lVar22 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                }
              }
              uVar6 = *(undefined8 *)(uVar29 + lVar22 * 8);
              fVar44 = local_10b8[lVar22];
              auVar79._8_4_ = fVar44;
              auVar79._0_8_ = uVar6;
              auVar79._12_4_ = 0;
              auVar76._8_4_ = -(uint)((int)fVar30 < (int)fVar42);
              uVar31 = uVar31 - 1 & uVar31;
              if (uVar31 == 0) {
                auVar76._4_4_ = auVar76._8_4_;
                auVar76._0_4_ = auVar76._8_4_;
                auVar76._12_4_ = auVar76._8_4_;
                auVar74._8_4_ = fVar42;
                auVar74._0_8_ = pSVar28;
                auVar74._12_4_ = 0;
                auVar63 = blendvps(auVar74,auVar71,auVar76);
                auVar32 = blendvps(auVar71,auVar75,auVar76);
                auVar33._8_4_ = -(uint)(auVar63._8_4_ < (int)fVar44);
                auVar33._4_4_ = auVar33._8_4_;
                auVar33._0_4_ = auVar33._8_4_;
                auVar33._12_4_ = auVar33._8_4_;
                auVar70._8_4_ = fVar44;
                auVar70._0_8_ = uVar6;
                auVar70._12_4_ = 0;
                auVar71 = blendvps(auVar70,auVar63,auVar33);
                auVar75 = blendvps(auVar63,auVar79,auVar33);
                auVar34._8_4_ = -(uint)(auVar32._8_4_ < auVar75._8_4_);
                auVar34._4_4_ = auVar34._8_4_;
                auVar34._0_4_ = auVar34._8_4_;
                auVar34._12_4_ = auVar34._8_4_;
                auVar63 = blendvps(auVar75,auVar32,auVar34);
                auVar32 = blendvps(auVar32,auVar75,auVar34);
                pRVar26->scene = (Scene *)auVar32._0_8_;
                pRVar26->user = (RTCRayQueryContext *)auVar32._8_8_;
                *(undefined1 (*) [16])&pRVar26->args = auVar63;
                puVar13 = auVar71._0_8_;
                pRVar26 = (RayQueryContext *)&pRVar26[1].user;
                context = pRVar26;
                pSVar28 = (Scene *)puVar13;
              }
              else {
                lVar22 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                  }
                }
                auVar35._4_4_ = auVar76._8_4_;
                auVar35._0_4_ = auVar76._8_4_;
                auVar35._8_4_ = auVar76._8_4_;
                auVar35._12_4_ = auVar76._8_4_;
                auVar76 = blendvps(auVar75,auVar71,auVar35);
                auVar32 = blendvps(auVar71,auVar75,auVar35);
                auVar78._8_4_ = local_10b8[lVar22];
                auVar78._0_8_ = *(undefined8 *)(uVar29 + lVar22 * 8);
                auVar78._12_4_ = 0;
                auVar36._8_4_ = -(uint)((int)fVar44 < (int)local_10b8[lVar22]);
                auVar36._4_4_ = auVar36._8_4_;
                auVar36._0_4_ = auVar36._8_4_;
                auVar36._12_4_ = auVar36._8_4_;
                auVar71 = blendvps(auVar78,auVar79,auVar36);
                auVar63 = blendvps(auVar79,auVar78,auVar36);
                auVar37._8_4_ = -(uint)(auVar32._8_4_ < auVar63._8_4_);
                auVar37._4_4_ = auVar37._8_4_;
                auVar37._0_4_ = auVar37._8_4_;
                auVar37._12_4_ = auVar37._8_4_;
                auVar79 = blendvps(auVar63,auVar32,auVar37);
                auVar32 = blendvps(auVar32,auVar63,auVar37);
                auVar38._8_4_ = -(uint)(auVar76._8_4_ < auVar71._8_4_);
                auVar38._4_4_ = auVar38._8_4_;
                auVar38._0_4_ = auVar38._8_4_;
                auVar38._12_4_ = auVar38._8_4_;
                auVar63 = blendvps(auVar71,auVar76,auVar38);
                auVar75 = blendvps(auVar76,auVar71,auVar38);
                auVar39._8_4_ = -(uint)(auVar75._8_4_ < auVar79._8_4_);
                auVar39._4_4_ = auVar39._8_4_;
                auVar39._0_4_ = auVar39._8_4_;
                auVar39._12_4_ = auVar39._8_4_;
                auVar71 = blendvps(auVar79,auVar75,auVar39);
                auVar75 = blendvps(auVar75,auVar79,auVar39);
                pRVar26->scene = (Scene *)auVar32._0_8_;
                pRVar26->user = (RTCRayQueryContext *)auVar32._8_8_;
                *(undefined1 (*) [16])&pRVar26->args = auVar75;
                pRVar26[1].user = (RTCRayQueryContext *)auVar71._0_8_;
                pRVar26[1].args = (RTCIntersectArguments *)auVar71._8_8_;
                puVar13 = auVar63._0_8_;
                pRVar26 = pRVar26 + 2;
                context = pRVar26;
                pSVar28 = (Scene *)puVar13;
              }
            }
          }
        }
        lVar22 = (ulong)((uint)pSVar28 & 0xf) - 8;
        uVar29 = (ulong)pSVar28 & 0xfffffffffffffff0;
        for (lVar24 = 0; lVar24 != lVar22; lVar24 = lVar24 + 1) {
          lVar21 = lVar24 * 0xb0;
          pfVar2 = (float *)(uVar29 + 0x80 + lVar21);
          fVar73 = *pfVar2;
          fVar77 = pfVar2[1];
          fVar104 = pfVar2[2];
          fVar86 = pfVar2[3];
          pfVar2 = (float *)(uVar29 + 0x40 + lVar21);
          fVar105 = *pfVar2;
          fVar62 = pfVar2[1];
          fVar66 = pfVar2[2];
          fVar67 = pfVar2[3];
          pfVar2 = (float *)(uVar29 + 0x70 + lVar21);
          fVar68 = *pfVar2;
          fVar83 = pfVar2[1];
          fVar84 = pfVar2[2];
          fVar90 = pfVar2[3];
          pfVar2 = (float *)(uVar29 + 0x50 + lVar21);
          fVar88 = *pfVar2;
          fVar91 = pfVar2[1];
          fVar93 = pfVar2[2];
          fVar96 = pfVar2[3];
          fVar118 = fVar68 * fVar88 - fVar73 * fVar105;
          fVar119 = fVar83 * fVar91 - fVar77 * fVar62;
          fVar120 = fVar84 * fVar93 - fVar104 * fVar66;
          fVar121 = fVar90 * fVar96 - fVar86 * fVar67;
          pfVar2 = (float *)(uVar29 + 0x60 + lVar21);
          fVar98 = *pfVar2;
          fVar100 = pfVar2[1];
          fVar102 = pfVar2[2];
          fVar103 = pfVar2[3];
          pfVar2 = (float *)(uVar29 + lVar21);
          pfVar1 = (float *)(uVar29 + 0x10 + lVar21);
          fStack_118c = *(float *)&This->ptr;
          fVar72 = *(float *)((long)&This->ptr + 4);
          fVar85 = *(float *)&This->leafIntersector;
          fVar82 = *(float *)&(This->collider).collide;
          fVar108 = *(float *)((long)&(This->collider).collide + 4);
          fVar110 = *(float *)&(This->collider).name;
          fVar54 = *pfVar2 - fStack_118c;
          fVar57 = pfVar2[1] - fStack_118c;
          fStack_1190 = pfVar2[2] - fStack_118c;
          fStack_118c = pfVar2[3] - fStack_118c;
          fVar69 = *pfVar1 - fVar72;
          fVar30 = pfVar1[1] - fVar72;
          fVar42 = pfVar1[2] - fVar72;
          fVar72 = pfVar1[3] - fVar72;
          fVar111 = fVar54 * fVar108 - fVar82 * fVar69;
          fVar113 = fVar57 * fVar108 - fVar82 * fVar30;
          fVar115 = fStack_1190 * fVar108 - fVar82 * fVar42;
          fVar117 = fStack_118c * fVar108 - fVar82 * fVar72;
          pfVar2 = (float *)(uVar29 + 0x30 + lVar21);
          fVar87 = *pfVar2;
          fVar112 = pfVar2[1];
          fVar114 = pfVar2[2];
          fVar116 = pfVar2[3];
          local_1018._0_4_ = fVar73 * fVar87 - fVar88 * fVar98;
          local_1018._4_4_ = fVar77 * fVar112 - fVar91 * fVar100;
          local_1018._8_4_ = fVar104 * fVar114 - fVar93 * fVar102;
          local_1018._12_4_ = fVar86 * fVar116 - fVar96 * fVar103;
          pfVar2 = (float *)(uVar29 + 0x20 + lVar21);
          fVar106 = *pfVar2 - fVar85;
          fVar107 = pfVar2[1] - fVar85;
          fVar109 = pfVar2[2] - fVar85;
          fVar85 = pfVar2[3] - fVar85;
          local_1198 = CONCAT44(fVar57,fVar54);
          fVar95 = fVar82 * fVar106 - fVar54 * fVar110;
          fVar97 = fVar82 * fVar107 - fVar57 * fVar110;
          fVar99 = fVar82 * fVar109 - fStack_1190 * fVar110;
          fVar101 = fVar82 * fVar85 - fStack_118c * fVar110;
          local_1008[0] = fVar105 * fVar98 - fVar68 * fVar87;
          local_1008[1] = fVar62 * fVar100 - fVar83 * fVar112;
          local_1008[2] = fVar66 * fVar102 - fVar84 * fVar114;
          local_1008[3] = fVar67 * fVar103 - fVar90 * fVar116;
          fVar44 = fVar110 * fVar69 - fVar108 * fVar106;
          fVar46 = fVar110 * fVar30 - fVar108 * fVar107;
          fVar52 = fVar110 * fVar42 - fVar108 * fVar109;
          fVar55 = fVar110 * fVar72 - fVar108 * fVar85;
          fVar58 = fVar108 * local_1018._0_4_ + fVar110 * local_1008[0] + fVar118 * fVar82;
          fVar60 = fVar108 * local_1018._4_4_ + fVar110 * local_1008[1] + fVar119 * fVar82;
          fVar81 = fVar108 * local_1018._8_4_ + fVar110 * local_1008[2] + fVar120 * fVar82;
          fVar82 = fVar108 * local_1018._12_4_ + fVar110 * local_1008[3] + fVar121 * fVar82;
          uVar43 = (uint)fVar58 & 0x80000000;
          uVar45 = (uint)fVar60 & 0x80000000;
          uVar47 = (uint)fVar81 & 0x80000000;
          uVar53 = (uint)fVar82 & 0x80000000;
          local_10b8[0] =
               (float)((uint)(fVar98 * fVar44 + fVar68 * fVar95 + fVar73 * fVar111) ^ uVar43);
          local_10b8[1] =
               (float)((uint)(fVar100 * fVar46 + fVar83 * fVar97 + fVar77 * fVar113) ^ uVar45);
          local_10b8[2] =
               (float)((uint)(fVar102 * fVar52 + fVar84 * fVar99 + fVar104 * fVar115) ^ uVar47);
          local_10b8[3] =
               (float)((uint)(fVar103 * fVar55 + fVar90 * fVar101 + fVar86 * fVar117) ^ uVar53);
          local_10a8 = (float)((uint)(fVar44 * fVar87 + fVar95 * fVar105 + fVar111 * fVar88) ^
                              uVar43);
          fStack_10a4 = (float)((uint)(fVar46 * fVar112 + fVar97 * fVar62 + fVar113 * fVar91) ^
                               uVar45);
          fStack_10a0 = (float)((uint)(fVar52 * fVar114 + fVar99 * fVar66 + fVar115 * fVar93) ^
                               uVar47);
          fStack_109c = (float)((uint)(fVar55 * fVar116 + fVar101 * fVar67 + fVar117 * fVar96) ^
                               uVar53);
          fVar73 = ABS(fVar58);
          fVar77 = ABS(fVar60);
          local_1088._0_8_ = CONCAT44(fVar60,fVar58) & 0x7fffffff7fffffff;
          local_1088._8_4_ = ABS(fVar81);
          local_1088._12_4_ = ABS(fVar82);
          auVar80._0_4_ =
               -(uint)(local_10b8[0] + local_10a8 <= fVar73) &
               -(uint)((0.0 <= local_10a8 && 0.0 <= local_10b8[0]) && fVar58 != 0.0) & local_ff8;
          auVar80._4_4_ =
               -(uint)(local_10b8[1] + fStack_10a4 <= fVar77) &
               -(uint)((0.0 <= fStack_10a4 && 0.0 <= local_10b8[1]) && fVar60 != 0.0) & uStack_ff4;
          auVar80._8_4_ =
               -(uint)(local_10b8[2] + fStack_10a0 <= local_1088._8_4_) &
               -(uint)((0.0 <= fStack_10a0 && 0.0 <= local_10b8[2]) && fVar81 != 0.0) & uStack_ff0;
          auVar80._12_4_ =
               -(uint)(local_10b8[3] + fStack_109c <= local_1088._12_4_) &
               -(uint)((0.0 <= fStack_109c && 0.0 <= local_10b8[3]) && fVar82 != 0.0) & uStack_fec;
          uVar31 = movmskps((int)puVar13,auVar80);
          puVar13 = (undefined1 *)(ulong)uVar31;
          if (uVar31 != 0) {
            local_1098 = (float)(uVar43 ^ (uint)(fVar54 * fVar118 +
                                                fVar69 * local_1018._0_4_ + fVar106 * local_1008[0])
                                );
            fStack_1094 = (float)(uVar45 ^ (uint)(fVar57 * fVar119 +
                                                 fVar30 * local_1018._4_4_ + fVar107 * local_1008[1]
                                                 ));
            fStack_1090 = (float)(uVar47 ^ (uint)(fStack_1190 * fVar120 +
                                                 fVar42 * local_1018._8_4_ + fVar109 * local_1008[2]
                                                 ));
            fStack_108c = (float)(uVar53 ^ (uint)(fStack_118c * fVar121 +
                                                 fVar72 * local_1018._12_4_ + fVar85 * local_1008[3]
                                                 ));
            fVar104 = *(float *)((long)&This->leafIntersector + 4);
            auVar4._0_8_ = (This->intersector1).intersect;
            auVar4._8_8_ = (This->intersector1).occluded;
            fVar86 = (float)auVar4._0_8_;
            uVar89 = (undefined4)((ulong)auVar4._0_8_ >> 0x20);
            uVar92 = (undefined4)auVar4._8_8_;
            uVar94 = (undefined4)((ulong)auVar4._8_8_ >> 0x20);
            auVar40._0_4_ =
                 -(uint)(local_1098 <= fVar86 * fVar73 && fVar104 * fVar73 < local_1098) &
                 auVar80._0_4_;
            auVar40._4_4_ =
                 -(uint)(fStack_1094 <= fVar86 * fVar77 && fVar104 * fVar77 < fStack_1094) &
                 auVar80._4_4_;
            auVar40._8_4_ =
                 -(uint)(fStack_1090 <= fVar86 * local_1088._8_4_ &&
                        fVar104 * local_1088._8_4_ < fStack_1090) & auVar80._8_4_;
            auVar40._12_4_ =
                 -(uint)(fStack_108c <= fVar86 * local_1088._12_4_ &&
                        fVar104 * local_1088._12_4_ < fStack_108c) & auVar80._12_4_;
            uVar31 = movmskps(uVar31,auVar40);
            puVar13 = (undefined1 *)(ulong)uVar31;
            if (uVar31 != 0) {
              local_1068 = auVar40;
              local_1028._4_4_ = fVar119;
              local_1028._0_4_ = fVar118;
              local_1028._8_4_ = fVar120;
              local_1028._12_4_ = fVar121;
              local_1140 = *(long *)&(local_1148->super_RayK<1>).org.field_0;
              local_1188 = auVar40;
              auVar32 = rcpps(local_1028,local_1088);
              fVar62 = auVar32._0_4_;
              fVar66 = auVar32._4_4_;
              fVar67 = auVar32._8_4_;
              fVar68 = auVar32._12_4_;
              fVar62 = (1.0 - fVar73 * fVar62) * fVar62 + fVar62;
              fVar66 = (1.0 - fVar77 * fVar66) * fVar66 + fVar66;
              fVar67 = (1.0 - local_1088._8_4_ * fVar67) * fVar67 + fVar67;
              fVar68 = (1.0 - local_1088._12_4_ * fVar68) * fVar68 + fVar68;
              fVar73 = local_1098 * fVar62;
              fVar77 = fStack_1094 * fVar66;
              fVar104 = fStack_1090 * fVar67;
              fVar105 = fStack_108c * fVar68;
              local_1038[0] = fVar73;
              local_1038[1] = fVar77;
              local_1038[2] = fVar104;
              local_1038[3] = fVar105;
              local_1058[0] = local_10b8[0] * fVar62;
              local_1058[1] = local_10b8[1] * fVar66;
              local_1058[2] = local_10b8[2] * fVar67;
              local_1058[3] = local_10b8[3] * fVar68;
              local_1048[0] = fVar62 * local_10a8;
              local_1048[1] = fVar66 * fStack_10a4;
              local_1048[2] = fVar67 * fStack_10a0;
              local_1048[3] = fVar68 * fStack_109c;
              auVar8._4_4_ = fVar77;
              auVar8._0_4_ = fVar73;
              auVar8._8_4_ = fVar104;
              auVar8._12_4_ = fVar105;
              auVar63 = blendvps(_DAT_01f45a30,auVar8,auVar40);
              auVar64._4_4_ = auVar63._0_4_;
              auVar64._0_4_ = auVar63._4_4_;
              auVar64._8_4_ = auVar63._12_4_;
              auVar64._12_4_ = auVar63._8_4_;
              auVar32 = minps(auVar64,auVar63);
              auVar48._0_8_ = auVar32._8_8_;
              auVar48._8_4_ = auVar32._0_4_;
              auVar48._12_4_ = auVar32._4_4_;
              auVar32 = minps(auVar48,auVar32);
              auVar49._0_8_ =
                   CONCAT44(-(uint)(auVar32._4_4_ == auVar63._4_4_) & auVar40._4_4_,
                            -(uint)(auVar32._0_4_ == auVar63._0_4_) & auVar40._0_4_);
              auVar49._8_4_ = -(uint)(auVar32._8_4_ == auVar63._8_4_) & auVar40._8_4_;
              auVar49._12_4_ = -(uint)(auVar32._12_4_ == auVar63._12_4_) & auVar40._12_4_;
              iVar12 = movmskps((int)local_1140,auVar49);
              if (iVar12 != 0) {
                auVar40._8_4_ = auVar49._8_4_;
                auVar40._0_8_ = auVar49._0_8_;
                auVar40._12_4_ = auVar49._12_4_;
              }
              uVar6 = extractps(auVar4,1);
              local_11b8 = (uint)uVar6;
              uVar14 = movmskps((int)context,auVar40);
              uVar16 = CONCAT44((int)((ulong)context >> 0x20),uVar14);
              pbVar17 = (byte *)0x0;
              if (uVar16 != 0) {
                for (; (uVar16 >> (long)pbVar17 & 1) == 0; pbVar17 = pbVar17 + 1) {
                }
              }
              local_1198 = lVar21 + uVar29;
              do {
                local_10f0 = *(uint *)(local_1198 + 0x90 + (long)pbVar17 * 4);
                pbVar7 = *(byte **)(*(long *)(local_1140 + 0x1e8) + (ulong)local_10f0 * 8);
                puVar13 = (undefined1 *)(ulong)local_11b8;
                if ((*(uint *)(pbVar7 + 0x34) & local_11b8) == 0) {
                  *(undefined4 *)(local_1188 + (long)pbVar17 * 4) = 0;
                }
                else {
                  local_1150 = *(byte **)&(local_1148->super_RayK<1>).dir.field_0;
                  if (*(long *)(local_1150 + 0x10) == 0) {
                    local_1128 = *(uint **)((long)&(local_1148->super_RayK<1>).org.field_0 + 8);
                    if (*(long *)(pbVar7 + 0x40) == 0) {
                      fVar73 = local_1058[(long)pbVar17];
                      fVar77 = local_1048[(long)pbVar17];
                      *(float *)&(This->intersector1).intersect = local_1038[(long)pbVar17];
                      *(undefined4 *)&(This->intersector1).pointQuery =
                           *(undefined4 *)(local_1028 + (long)pbVar17 * 4);
                      *(undefined4 *)((long)&(This->intersector1).pointQuery + 4) =
                           *(undefined4 *)(local_1018 + (long)pbVar17 * 4);
                      *(float *)&(This->intersector1).name = local_1008[(long)pbVar17];
                      *(float *)((long)&(This->intersector1).name + 4) = fVar73;
                      *(float *)&(This->intersector4).intersect = fVar77;
                      *(undefined4 *)((long)&(This->intersector4).intersect + 4) =
                           *(undefined4 *)(local_1198 + 0xa0 + (long)pbVar17 * 4);
                      *(uint *)&(This->intersector4).occluded = local_10f0;
                      context = (RayQueryContext *)(ulong)*local_1128;
                      *(uint *)((long)&(This->intersector4).occluded + 4) = *local_1128;
                      puVar13 = (undefined1 *)(ulong)local_1128[1];
                      *(uint *)&(This->intersector4).name = local_1128[1];
                      break;
                    }
                    local_10d8 = fVar86;
                    uStack_10d4 = uVar89;
                    uStack_10d0 = uVar92;
                    uStack_10cc = uVar94;
                    local_10c8 = fVar73;
                    fStack_10c4 = fVar77;
                    fStack_10c0 = fVar104;
                    fStack_10bc = fVar105;
                    local_1170 = lVar24;
                    local_1168 = lVar22;
                    local_1160 = uVar23;
                    local_1158 = uVar25;
                  }
                  else {
                    local_10d8 = fVar86;
                    uStack_10d4 = uVar89;
                    uStack_10d0 = uVar92;
                    uStack_10cc = uVar94;
                    local_10c8 = fVar73;
                    fStack_10c4 = fVar77;
                    fStack_10c0 = fVar104;
                    fStack_10bc = fVar105;
                    local_1170 = lVar24;
                    local_1168 = lVar22;
                    local_1160 = uVar23;
                    local_1158 = uVar25;
                    local_1128 = *(uint **)((long)&(local_1148->super_RayK<1>).org.field_0 + 8);
                  }
                  local_1108 = *(undefined4 *)(local_1028 + (long)pbVar17 * 4);
                  local_1104 = *(undefined4 *)(local_1018 + (long)pbVar17 * 4);
                  local_1100 = local_1008[(long)pbVar17];
                  local_10fc = local_1058[(long)pbVar17];
                  local_10f8 = local_1048[(long)pbVar17];
                  local_10f4 = *(undefined4 *)(local_1198 + 0xa0 + (long)pbVar17 * 4);
                  local_10ec = *local_1128;
                  local_10e8 = local_1128[1];
                  *(float *)&(This->intersector1).intersect = local_1038[(long)pbVar17];
                  local_119c = -1;
                  local_1138 = &local_119c;
                  pbVar18 = *(byte **)(pbVar7 + 0x18);
                  local_1130 = pbVar18;
                  local_1120 = This;
                  local_1118 = &local_1108;
                  local_1110 = 1;
                  local_1170 = lVar24;
                  local_1168 = lVar22;
                  local_1160 = uVar23;
                  local_1158 = uVar25;
                  local_10d8 = fVar86;
                  uStack_10d4 = uVar89;
                  uStack_10d0 = uVar92;
                  uStack_10cc = uVar94;
                  local_10c8 = fVar73;
                  fStack_10c4 = fVar77;
                  fStack_10c0 = fVar104;
                  fStack_10bc = fVar105;
                  if (((*(code **)(pbVar7 + 0x40) == (code *)0x0) ||
                      ((**(code **)(pbVar7 + 0x40))(&local_1138), *local_1138 != 0)) &&
                     ((*(code **)(local_1150 + 0x10) == (code *)0x0 ||
                      (((pbVar18 = local_1150, (*local_1150 & 2) == 0 &&
                        (pbVar18 = pbVar7, (pbVar7[0x3e] & 0x40) == 0)) ||
                       ((**(code **)(local_1150 + 0x10))(&local_1138), *local_1138 != 0)))))) {
                    *(undefined4 *)&(local_1120->intersector1).pointQuery = *local_1118;
                    *(undefined4 *)((long)&(local_1120->intersector1).pointQuery + 4) =
                         local_1118[1];
                    *(undefined4 *)&(local_1120->intersector1).name = local_1118[2];
                    *(undefined4 *)((long)&(local_1120->intersector1).name + 4) = local_1118[3];
                    *(undefined4 *)&(local_1120->intersector4).intersect = local_1118[4];
                    *(undefined4 *)((long)&(local_1120->intersector4).intersect + 4) = local_1118[5]
                    ;
                    *(undefined4 *)&(local_1120->intersector4).occluded = local_1118[6];
                    *(undefined4 *)((long)&(local_1120->intersector4).occluded + 4) = local_1118[7];
                    pbVar18 = (byte *)(ulong)(uint)local_1118[8];
                    *(undefined4 *)&(local_1120->intersector4).name = local_1118[8];
                  }
                  else {
                    *(float *)&(This->intersector1).intersect = local_10d8;
                  }
                  *(undefined4 *)(local_1188 + (long)pbVar17 * 4) = 0;
                  auVar5._0_8_ = (This->intersector1).intersect;
                  auVar5._8_8_ = (This->intersector1).occluded;
                  fVar86 = (float)auVar5._0_8_;
                  uVar89 = (undefined4)((ulong)auVar5._0_8_ >> 0x20);
                  uVar92 = (undefined4)auVar5._8_8_;
                  uVar94 = (undefined4)((ulong)auVar5._8_8_ >> 0x20);
                  local_1188._0_4_ = -(uint)(local_10c8 <= fVar86) & local_1188._0_4_;
                  local_1188._4_4_ = -(uint)(fStack_10c4 <= fVar86) & local_1188._4_4_;
                  local_1188._8_4_ = -(uint)(fStack_10c0 <= fVar86) & local_1188._8_4_;
                  local_1188._12_4_ = -(uint)(fStack_10bc <= fVar86) & local_1188._12_4_;
                  puVar13 = (undefined1 *)extractps(auVar5,1);
                  pbVar17 = pbVar18;
                  lVar22 = local_1168;
                  uVar23 = local_1160;
                  lVar24 = local_1170;
                  uVar25 = local_1158;
                  fVar73 = local_10c8;
                  fVar77 = fStack_10c4;
                  fVar104 = fStack_10c0;
                  fVar105 = fStack_10bc;
                }
                uVar14 = (undefined4)((ulong)pbVar17 >> 0x20);
                iVar12 = movmskps((int)pbVar17,local_1188);
                context = (RayQueryContext *)CONCAT44(uVar14,iVar12);
                if (iVar12 == 0) break;
                auVar9._4_4_ = fVar77;
                auVar9._0_4_ = fVar73;
                auVar9._8_4_ = fVar104;
                auVar9._12_4_ = fVar105;
                auVar63 = blendvps(_DAT_01f45a30,auVar9,local_1188);
                auVar65._4_4_ = auVar63._0_4_;
                auVar65._0_4_ = auVar63._4_4_;
                auVar65._8_4_ = auVar63._12_4_;
                auVar65._12_4_ = auVar63._8_4_;
                auVar32 = minps(auVar65,auVar63);
                auVar50._0_8_ = auVar32._8_8_;
                auVar50._8_4_ = auVar32._0_4_;
                auVar50._12_4_ = auVar32._4_4_;
                auVar32 = minps(auVar50,auVar32);
                auVar51._0_8_ =
                     CONCAT44(-(uint)(auVar32._4_4_ == auVar63._4_4_) & local_1188._4_4_,
                              -(uint)(auVar32._0_4_ == auVar63._0_4_) & local_1188._0_4_);
                auVar51._8_4_ = -(uint)(auVar32._8_4_ == auVar63._8_4_) & local_1188._8_4_;
                auVar51._12_4_ = -(uint)(auVar32._12_4_ == auVar63._12_4_) & local_1188._12_4_;
                iVar12 = movmskps(iVar12,auVar51);
                auVar41 = local_1188;
                if (iVar12 != 0) {
                  auVar41._8_4_ = auVar51._8_4_;
                  auVar41._0_8_ = auVar51._0_8_;
                  auVar41._12_4_ = auVar51._12_4_;
                }
                uVar15 = movmskps(iVar12,auVar41);
                uVar16 = CONCAT44(uVar14,uVar15);
                pbVar17 = (byte *)0x0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> (long)pbVar17 & 1) == 0; pbVar17 = pbVar17 + 1) {
                  }
                }
                local_11b8 = (uint)puVar13;
              } while( true );
            }
          }
          fVar105 = local_f88;
          fVar62 = fStack_f84;
          fVar66 = fStack_f80;
          fVar67 = fStack_f7c;
          fVar73 = local_f98;
          fVar68 = fStack_f94;
          fVar83 = fStack_f90;
          fVar84 = fStack_f8c;
          fVar90 = local_fa8;
          fVar88 = fStack_fa4;
          fVar91 = fStack_fa0;
          fVar93 = fStack_f9c;
          fVar104 = local_fb8;
          fVar96 = fStack_fb4;
          fVar98 = fStack_fb0;
          fVar100 = fStack_fac;
          fVar86 = local_fc8;
          fVar102 = fStack_fc4;
          fVar103 = fStack_fc0;
          fVar72 = fStack_fbc;
          fVar85 = local_fd8;
          fVar82 = fStack_fd4;
          fVar108 = fStack_fd0;
          fVar110 = fStack_fcc;
          fVar87 = local_fe8;
          fVar112 = fStack_fe4;
          fVar114 = fStack_fe0;
          fVar116 = fStack_fdc;
        }
        fVar77 = *(float *)&(This->intersector1).intersect;
        fVar54 = fVar77;
        fVar57 = fVar77;
        fVar69 = fVar77;
      }
      goto LAB_0067e8bd;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }